

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nibbler.cpp
# Opt level: O2

bool __thiscall Nibbler::getInt(Nibbler *this,int *result)

{
  char cVar1;
  ulong uVar2;
  pointer pcVar3;
  ulong uVar4;
  intmax_t iVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  char *local_48 [4];
  
  uVar2 = this->_cursor;
  pcVar3 = (this->_input)._M_dataplus._M_p;
  uVar4 = this->_length;
  uVar6 = uVar2;
  if (uVar2 < uVar4) {
    cVar1 = pcVar3[uVar2];
    if (cVar1 == '-') {
      uVar6 = uVar2 + 1;
    }
    else {
      uVar6 = (cVar1 == '+') + uVar2;
    }
  }
  uVar7 = uVar4;
  if (uVar4 < uVar6) {
    uVar7 = uVar6;
  }
  while ((uVar8 = uVar7, uVar6 < uVar4 && (uVar8 = uVar6, (int)pcVar3[uVar6] - 0x30U < 10))) {
    uVar6 = uVar6 + 1;
  }
  if (uVar2 < uVar8) {
    std::__cxx11::string::substr((ulong)local_48,(ulong)this);
    iVar5 = strtoimax(local_48[0],(char **)0x0,10);
    *result = (int)iVar5;
    std::__cxx11::string::~string((string *)local_48);
    this->_cursor = uVar8;
  }
  return uVar2 < uVar8;
}

Assistant:

bool Nibbler::getInt (int& result)
{
  std::string::size_type i = _cursor;

  if (i < _length)
  {
    if (_input[i] == '-')
      ++i;
    else if (_input[i] == '+')
      ++i;
  }

  // TODO Potential for use of find_first_not_of
  while (i < _length && isdigit (_input[i]))
    ++i;

  if (i > _cursor)
  {
    result = strtoimax (_input.substr (_cursor, i - _cursor).c_str (), NULL, 10);
    _cursor = i;
    return true;
  }

  return false;
}